

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListShiftJoinType(Parse *pParse,SrcList *p)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  u8 *puVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  
  if (pParse != (Parse *)0x0) {
    uVar2 = *(uint *)&pParse->db;
    lVar5 = (long)(int)uVar2;
    if (1 < lVar5) {
      lVar9 = lVar5 + 1;
      pbVar11 = (byte *)((long)pParse + lVar5 * 0x48 + -0x28);
      bVar6 = 0;
      do {
        pbVar1 = pbVar11 + -0x48;
        *pbVar11 = *pbVar1;
        pbVar11 = pbVar11 + -0x48;
        bVar6 = bVar6 | *pbVar1;
        lVar9 = lVar9 + -1;
      } while (2 < lVar9);
      pParse->isMultiWrite = '\0';
      if ((bVar6 & 0x10) != 0) {
        pbVar11 = (byte *)((long)pParse + (ulong)uVar2 * 0x48 + -0x28);
        uVar4 = (ulong)uVar2;
        do {
          uVar10 = uVar4;
          if ((long)uVar10 < 2) break;
          bVar6 = *pbVar11;
          pbVar11 = pbVar11 + -0x48;
          uVar4 = uVar10 - 1;
        } while ((bVar6 & 0x10) == 0);
        iVar7 = 1;
        if (1 < (long)uVar10) {
          iVar7 = (int)uVar10;
        }
        puVar8 = &pParse->isMultiWrite + (long)(iVar7 + -2) * 0x48;
        lVar5 = (long)(iVar7 + -2) + 1;
        do {
          *puVar8 = *puVar8 | 0x40;
          puVar8 = puVar8 + -0x48;
          lVar9 = lVar5 + -1;
          bVar3 = 0 < lVar5;
          lVar5 = lVar9;
        } while (lVar9 != 0 && bVar3);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(Parse *pParse, SrcList *p){
  (void)pParse;
  if( p && p->nSrc>1 ){
    int i = p->nSrc-1;
    u8 allFlags = 0;
    do{
      allFlags |= p->a[i].fg.jointype = p->a[i-1].fg.jointype;
    }while( (--i)>0 );
    p->a[0].fg.jointype = 0;

    /* All terms to the left of a RIGHT JOIN should be tagged with the
    ** JT_LTORJ flags */
    if( allFlags & JT_RIGHT ){
      for(i=p->nSrc-1; ALWAYS(i>0) && (p->a[i].fg.jointype&JT_RIGHT)==0; i--){}
      i--;
      assert( i>=0 );
      do{
        p->a[i].fg.jointype |= JT_LTORJ;
      }while( (--i)>=0 );
    }
  }
}